

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall cppcms::application::application(application *this,service *srv)

{
  _data *p_Var1;
  url_dispatcher *this_00;
  url_mapper *this_01;
  
  this->_vptr_application = (_func_int **)&PTR__application_00288c18;
  p_Var1 = (_data *)operator_new(0x58);
  p_Var1->service = srv;
  (p_Var1->conn).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (p_Var1->conn).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1->temp_conn = (context *)0x0;
  (p_Var1->url_disp).ptr_ = (url_dispatcher *)0x0;
  (p_Var1->url_map).ptr_ = (url_mapper *)0x0;
  (p_Var1->managed_children).
  super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (p_Var1->managed_children).
  super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (p_Var1->managed_children).
  super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (p_Var1->my_pool).super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (p_Var1->my_pool).super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->d).ptr_ = p_Var1;
  booster::atomic_counter::atomic_counter(&this->refs_,0);
  this->root_ = this;
  this->parent_ = this;
  p_Var1 = (this->d).ptr_;
  this_00 = (url_dispatcher *)operator_new(8);
  url_dispatcher::url_dispatcher(this_00,this);
  booster::hold_ptr<cppcms::url_dispatcher>::reset(&p_Var1->url_disp,this_00);
  p_Var1 = (this->d).ptr_;
  this_01 = (url_mapper *)operator_new(8);
  url_mapper::url_mapper(this_01,this);
  booster::hold_ptr<cppcms::url_mapper>::reset(&p_Var1->url_map,this_01);
  return;
}

Assistant:

application::application(cppcms::service &srv) :
	d(new _data(&srv)),
	refs_(0)
{
	parent_=root_=this;
	d->url_disp.reset(new url_dispatcher(this));
	d->url_map.reset(new url_mapper(this));
}